

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * mg_get_header(mg_connection *conn,char *name)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  if (conn == (mg_connection *)0x0) {
    return (char *)0x0;
  }
  if (conn->connection_type == 1) {
    lVar3 = 0xa0;
    lVar1 = 0xa8;
  }
  else {
    if (conn->connection_type != 2) {
      return (char *)0x0;
    }
    lVar3 = 0x4d8;
    lVar1 = 0x4e0;
  }
  pcVar2 = get_header((mg_header *)((conn->request_info).remote_addr + lVar1 + -0x48),
                      *(int *)((conn->request_info).remote_addr + lVar3 + -0x48),name);
  return pcVar2;
}

Assistant:

CIVETWEB_API const char *
mg_get_header(const struct mg_connection *conn, const char *name)
{
	if (!conn) {
		return NULL;
	}

	if (conn->connection_type == CONNECTION_TYPE_REQUEST) {
		return get_header(conn->request_info.http_headers,
		                  conn->request_info.num_headers,
		                  name);
	}
	if (conn->connection_type == CONNECTION_TYPE_RESPONSE) {
		return get_header(conn->response_info.http_headers,
		                  conn->response_info.num_headers,
		                  name);
	}
	return NULL;
}